

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<float>::ValueArg
          (ValueArg<float> *this,string *flag,string *name,string *desc,bool req,float val,
          string *typeDesc,Visitor *v)

{
  undefined8 *in_RDI;
  string *in_R9;
  undefined4 in_XMM0_Da;
  bool in_stack_000003d6;
  bool in_stack_000003d7;
  string *in_stack_000003d8;
  string *in_stack_000003e0;
  string *in_stack_000003e8;
  Arg *in_stack_000003f0;
  Visitor *in_stack_00000400;
  
  Arg::Arg(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,in_stack_000003d7
           ,in_stack_000003d6,in_stack_00000400);
  *in_RDI = &PTR__ValueArg_00433d10;
  *(undefined4 *)((long)in_RDI + 0xa4) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x15) = in_XMM0_Da;
  std::__cxx11::string::string((string *)(in_RDI + 0x16),in_R9);
  in_RDI[0x1a] = 0;
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ }